

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# user_geometry_device.cpp
# Opt level: O2

void embree::sphereBoundsFunc(RTCBoundsFunctionArguments *args)

{
  void *pvVar1;
  RTCBounds *pRVar2;
  long lVar3;
  
  pvVar1 = args->geometryUserPtr;
  pRVar2 = args->bounds_o;
  lVar3 = (ulong)args->primID * 0x40;
  pRVar2->lower_x =
       *(float *)((long)pvVar1 + lVar3 + 0x10) - *(float *)((long)pvVar1 + lVar3 + 0x20);
  pRVar2->lower_y =
       *(float *)((long)pvVar1 + lVar3 + 0x14) - *(float *)((long)pvVar1 + lVar3 + 0x20);
  pRVar2->lower_z =
       *(float *)((long)pvVar1 + lVar3 + 0x18) - *(float *)((long)pvVar1 + lVar3 + 0x20);
  pRVar2->upper_x =
       *(float *)((long)pvVar1 + lVar3 + 0x10) + *(float *)((long)pvVar1 + lVar3 + 0x20);
  pRVar2->upper_y =
       *(float *)((long)pvVar1 + lVar3 + 0x14) + *(float *)((long)pvVar1 + lVar3 + 0x20);
  pRVar2->upper_z =
       *(float *)((long)pvVar1 + lVar3 + 0x18) + *(float *)((long)pvVar1 + lVar3 + 0x20);
  return;
}

Assistant:

void sphereBoundsFunc(const struct RTCBoundsFunctionArguments* args)
{
  const Sphere* spheres = (const Sphere*) args->geometryUserPtr;
  RTCBounds* bounds_o = args->bounds_o;
  const Sphere& sphere = spheres[args->primID];
  bounds_o->lower_x = sphere.p.x-sphere.r;
  bounds_o->lower_y = sphere.p.y-sphere.r;
  bounds_o->lower_z = sphere.p.z-sphere.r;
  bounds_o->upper_x = sphere.p.x+sphere.r;
  bounds_o->upper_y = sphere.p.y+sphere.r;
  bounds_o->upper_z = sphere.p.z+sphere.r;
}